

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::FileMonitorTask::checkArguments
          (FileMonitorTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterOrThis)

{
  pointer ppEVar1;
  Expression *this_00;
  Type *this_01;
  long lVar2;
  long lVar3;
  MonitorVisitor visitor;
  MonitorVisitor local_30;
  
  this_01 = FileDisplayTask::checkArguments
                      (&this->super_FileDisplayTask,context,args,range,iterOrThis);
  if (this_01->canonical == (Type *)0x0) {
    Type::resolveCanonical(this_01);
  }
  if ((this_01->canonical->super_Symbol).kind != ErrorType) {
    lVar3 = (args->_M_extent)._M_extent_value << 3;
    if (lVar3 != 8) {
      ppEVar1 = args->_M_ptr;
      lVar2 = 8;
      local_30.context = context;
      do {
        this_00 = *(Expression **)((long)ppEVar1 + lVar2);
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                  (this_00,this_00,&local_30);
        lVar2 = lVar2 + 8;
      } while (lVar3 != lVar2);
    }
  }
  return this_01;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = FileDisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args.subspan(1))
            arg->visit(visitor);

        return result;
    }